

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
::HungarianSolver(HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                  *this,unsigned_long num_rows,unsigned_long num_cols,
                 less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator,
                 duration<long,_boost::ratio<1L,_1L>_> *zero_cost)

{
  allocator_type local_19;
  
  hungarian_algorithm::HungarianSolverBase::HungarianSolverBase
            (&this->super_HungarianSolverBase,num_rows,num_cols);
  this->cost_comparator_ = cost_comparator;
  (this->zero_cost_).rep_ = zero_cost->rep_;
  std::
  vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::vector(&this->cost_matrix_,*(long *)&this->field_0x8 * *(long *)this,zero_cost,&local_19);
  return;
}

Assistant:

HungarianSolver(const Size num_rows, const Size num_cols, const CostComparator& cost_comparator,
                  const Cost& zero_cost)
    : HungarianSolverBase(static_cast<std::size_t>(num_rows), static_cast<std::size_t>(num_cols)),
      cost_comparator_(cost_comparator), zero_cost_(zero_cost), cost_matrix_(num_rows_ * num_cols_, zero_cost)
  {
    if (num_rows < 0 || num_cols < 0)
    {
      throw std::invalid_argument("Hungarian algorithm: num_rows and num_cols must be non-negative");
    }
  }